

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_sse4.c
# Opt level: O1

int av1_selfguided_restoration_sse4_1
              (uint8_t *dgd8,int width,int height,int dgd_stride,int32_t *flt0,int32_t *flt1,
              int flt_stride,int sgr_params_idx,int bit_depth,int highbd)

{
  void *__s;
  int *piVar1;
  uint uVar2;
  size_t __n;
  undefined8 *puVar3;
  int *piVar4;
  int32_t *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  uint *puVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  int32_t iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  void *__s_00;
  long lVar32;
  byte bVar33;
  void *pvVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  undefined1 (*pauVar41) [16];
  long lVar42;
  uint uVar43;
  long lVar44;
  uint8_t *puVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM2 [16];
  __m128i rounding_a;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 in_XMM3 [16];
  __m128i rounding_b;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  int iVar61;
  ulong uVar62;
  undefined1 in_XMM4 [16];
  __m128i shift_a;
  undefined1 auVar63 [16];
  int iVar64;
  __m128i shift_b;
  int iVar65;
  int iVar66;
  int iVar68;
  __m128i sixes;
  int iVar69;
  int iVar70;
  undefined1 auVar67 [16];
  undefined1 in_XMM7 [16];
  undefined1 in_XMM8 [16];
  undefined1 in_XMM9 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  uint uVar74;
  uint uVar83;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  uint uVar84;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  __m128i mask [4];
  undefined1 local_78 [72];
  
  __s_00 = aom_memalign(0x10,0x1fa40);
  if (__s_00 == (void *)0x0) {
    iVar31 = -1;
  }
  else {
    memset(__s_00,0,0x1fa40);
    iVar31 = (width + 9U & 0xfffffffc) + 0x10;
    pvVar34 = (void *)((long)__s_00 + 0xfd2c);
    __s = (void *)((long)__s_00 + 0x17bbc);
    lVar32 = (long)iVar31;
    puVar45 = dgd8 + (dgd_stride * -3 + -3);
    lVar47 = (long)width;
    __n = lVar47 * 4 + 0x1c;
    if (highbd == 0) {
      memset(pvVar34,0,__n);
      memset(__s,0,__n);
      if (-6 < height) {
        lVar46 = (long)__s_00 + lVar32 * 4 + 0x17bc0;
        lVar36 = (long)__s_00 + 0x17bc0;
        uVar39 = 0;
        do {
          uVar39 = uVar39 + 1;
          *(undefined4 *)((long)__s + uVar39 * lVar32 * 4) = 0;
          *(undefined4 *)((long)pvVar34 + uVar39 * lVar32 * 4) = 0;
          if (-6 < width) {
            iVar66 = 0;
            lVar38 = 0;
            iVar70 = 0;
            do {
              in_XMM3 = *(undefined1 (*) [16])(lVar36 + lVar38 * 4);
              in_XMM2 = *(undefined1 (*) [16])(lVar36 + -0x7e90 + lVar38 * 4);
              auVar63 = pmovzxbd(in_XMM4,*(undefined4 *)(puVar45 + lVar38));
              iVar60 = auVar63._0_4_;
              iVar64 = iVar60 + auVar63._4_4_;
              in_XMM4 = pmaddwd(auVar63,auVar63);
              iVar61 = in_XMM4._0_4_;
              iVar68 = iVar61 + in_XMM4._4_4_;
              iVar65 = iVar64 + iVar66 + in_XMM3._12_4_ + auVar63._8_4_ + auVar63._12_4_;
              iVar69 = iVar68 + iVar70 + in_XMM2._12_4_ + in_XMM4._8_4_ + in_XMM4._12_4_;
              piVar1 = (int *)(lVar46 + lVar38 * 4);
              *piVar1 = iVar66 + in_XMM3._0_4_ + iVar60;
              piVar1[1] = iVar66 + in_XMM3._4_4_ + iVar64;
              piVar1[2] = iVar60 + iVar66 + in_XMM3._8_4_ + auVar63._4_4_ + auVar63._8_4_;
              piVar1[3] = iVar65;
              piVar1 = (int *)(lVar46 + -0x7e90 + lVar38 * 4);
              *piVar1 = iVar70 + in_XMM2._0_4_ + iVar61;
              piVar1[1] = iVar70 + in_XMM2._4_4_ + iVar68;
              piVar1[2] = iVar61 + iVar70 + in_XMM2._8_4_ + in_XMM4._4_4_ + in_XMM4._8_4_;
              piVar1[3] = iVar69;
              iVar66 = iVar65 - in_XMM3._12_4_;
              iVar70 = iVar69 - in_XMM2._12_4_;
              lVar38 = lVar38 + 4;
            } while (lVar38 < width + 6);
          }
          puVar45 = puVar45 + dgd_stride;
          lVar46 = lVar46 + lVar32 * 4;
          lVar36 = lVar36 + lVar32 * 4;
        } while (uVar39 != height + 6U);
      }
    }
    else {
      memset(pvVar34,0,__n);
      memset(__s,0,__n);
      if (-6 < height) {
        lVar46 = (long)puVar45 * 2;
        lVar36 = (long)__s_00 + lVar32 * 4 + 0x17bc0;
        lVar38 = (long)__s_00 + 0x17bc0;
        uVar39 = 0;
        do {
          uVar39 = uVar39 + 1;
          *(undefined4 *)((long)__s + uVar39 * lVar32 * 4) = 0;
          *(undefined4 *)((long)pvVar34 + uVar39 * lVar32 * 4) = 0;
          if (-6 < width) {
            iVar66 = 0;
            lVar42 = 0;
            iVar70 = 0;
            do {
              in_XMM3 = *(undefined1 (*) [16])(lVar38 + lVar42 * 4);
              in_XMM2 = *(undefined1 (*) [16])(lVar38 + -0x7e90 + lVar42 * 4);
              auVar63 = pmovzxwd(in_XMM4,*(undefined8 *)(lVar46 + lVar42 * 2));
              iVar60 = auVar63._0_4_;
              iVar64 = iVar60 + auVar63._4_4_;
              in_XMM4 = pmaddwd(auVar63,auVar63);
              iVar61 = in_XMM4._0_4_;
              iVar68 = iVar61 + in_XMM4._4_4_;
              iVar65 = iVar64 + iVar66 + in_XMM3._12_4_ + auVar63._8_4_ + auVar63._12_4_;
              iVar69 = iVar68 + iVar70 + in_XMM2._12_4_ + in_XMM4._8_4_ + in_XMM4._12_4_;
              piVar1 = (int *)(lVar36 + lVar42 * 4);
              *piVar1 = iVar66 + in_XMM3._0_4_ + iVar60;
              piVar1[1] = iVar66 + in_XMM3._4_4_ + iVar64;
              piVar1[2] = iVar60 + iVar66 + in_XMM3._8_4_ + auVar63._4_4_ + auVar63._8_4_;
              piVar1[3] = iVar65;
              piVar1 = (int *)(lVar36 + -0x7e90 + lVar42 * 4);
              *piVar1 = iVar70 + in_XMM2._0_4_ + iVar61;
              piVar1[1] = iVar70 + in_XMM2._4_4_ + iVar68;
              piVar1[2] = iVar61 + iVar70 + in_XMM2._8_4_ + in_XMM4._4_4_ + in_XMM4._8_4_;
              piVar1[3] = iVar69;
              iVar66 = iVar65 - in_XMM3._12_4_;
              iVar70 = iVar69 - in_XMM2._12_4_;
              lVar42 = lVar42 + 4;
            } while (lVar42 < width + 6);
          }
          lVar46 = lVar46 + (long)dgd_stride * 2;
          lVar36 = lVar36 + lVar32 * 4;
          lVar38 = lVar38 + lVar32 * 4;
        } while (uVar39 != height + 6U);
      }
    }
    lVar46 = (long)sgr_params_idx;
    uVar74 = av1_sgr_params[lVar46].r[0];
    lVar36 = (long)(iVar31 * 3);
    bVar33 = (byte)highbd;
    if (0 < (int)uVar74) {
      iVar66 = uVar74 * 2 + 1;
      iVar66 = iVar66 * iVar66;
      iVar70 = av1_sgr_params[lVar46].s[0];
      iVar14 = av1_one_by_x[iVar66 - 1];
      uVar39 = 0x20;
      pauVar41 = (undefined1 (*) [16])local_78;
      do {
        auVar86._8_4_ = 0xffffffff;
        auVar86._0_8_ = 0xffffffffffffffff;
        auVar86._12_4_ = 0xffffffff;
        auVar58._0_8_ = 0xffffffffffffffff >> (uVar39 & 0xffffffff);
        auVar58._8_8_ = auVar86._8_8_ >> (uVar39 & 0xffffffff);
        auVar63 = pmovsxbd(ZEXT416((uint)uVar39),auVar58);
        *pauVar41 = auVar63;
        pauVar41 = pauVar41 + 1;
        uVar39 = uVar39 - 8;
      } while (uVar39 != 0);
      if (-2 < height) {
        auVar63._4_4_ = iVar70;
        auVar63._0_4_ = iVar70;
        auVar63._8_4_ = iVar70;
        auVar63._12_4_ = iVar70;
        lVar48 = (long)(int)((uVar74 + 1) * iVar31);
        auVar58._4_4_ = iVar66;
        auVar58._0_4_ = iVar66;
        auVar58._8_4_ = iVar66;
        auVar58._12_4_ = iVar66;
        uVar2 = bit_depth * 2 - 0x10;
        uVar43 = 1 << ((byte)uVar2 & 0x1f);
        in_XMM2._0_4_ = uVar43 >> 1;
        in_XMM2._4_4_ = uVar43 >> 1;
        in_XMM2._8_4_ = uVar43 >> 1;
        in_XMM2._12_4_ = uVar43 >> 1;
        in_XMM3._0_4_ = (1 << ((byte)(bit_depth - 8U) & 0x1f)) >> 1;
        in_XMM3._4_4_ = in_XMM3._0_4_;
        in_XMM3._8_4_ = in_XMM3._0_4_;
        in_XMM3._12_4_ = in_XMM3._0_4_;
        auVar71._4_4_ = iVar14;
        auVar71._0_4_ = iVar14;
        auVar71._8_4_ = iVar14;
        auVar71._12_4_ = iVar14;
        pvVar34 = (void *)((long)__s_00 + lVar36 * 4);
        lVar42 = lVar32 * 8;
        lVar38 = lVar36 * 4 + (long)(int)(uVar74 * iVar31) * 4;
        lVar37 = (long)__s_00 + lVar38 + (ulong)uVar74 * 4 + 0xfd38;
        lVar44 = (long)__s_00 + (ulong)uVar74 * 4 + lVar36 * 4 + lVar48 * -4 + 0xfd38;
        lVar40 = (long)__s_00 + lVar38 + (long)(int)~uVar74 * 4 + 0xfd38;
        lVar48 = (long)__s_00 + lVar36 * 4 + (long)(int)~uVar74 * 4 + lVar48 * -4 + 0xfd38;
        lVar38 = -1;
        in_XMM7 = pmovsxbw(in_XMM7,0x800080008000800);
        in_XMM8 = pmovzxbd(in_XMM8,0xffffffff);
        in_XMM9 = pmovsxwd(in_XMM9,0x100010001000100);
        in_XMM10 = pmovsxwd(in_XMM10,0x800080008000800);
        do {
          if (-2 < width) {
            lVar35 = -1;
            iVar70 = width + 2;
            do {
              piVar1 = (int *)(lVar48 + 0x7e94 + lVar35 * 4);
              piVar6 = (int *)(lVar44 + 0x7e94 + lVar35 * 4);
              piVar7 = (int *)(lVar40 + 0x7e94 + lVar35 * 4);
              piVar8 = (int *)(lVar37 + 0x7e94 + lVar35 * 4);
              auVar72._0_4_ = *piVar8 + (*piVar1 - (*piVar7 + *piVar6));
              auVar72._4_4_ = piVar8[1] + (piVar1[1] - (piVar7[1] + piVar6[1]));
              auVar72._8_4_ = piVar8[2] + (piVar1[2] - (piVar7[2] + piVar6[2]));
              auVar72._12_4_ = piVar8[3] + (piVar1[3] - (piVar7[3] + piVar6[3]));
              piVar1 = (int *)(lVar48 + 4 + lVar35 * 4);
              piVar6 = (int *)(lVar44 + 4 + lVar35 * 4);
              piVar7 = (int *)(lVar40 + 4 + lVar35 * 4);
              piVar8 = (int *)(lVar37 + 4 + lVar35 * 4);
              auVar75._0_4_ = *piVar8 + (*piVar1 - (*piVar7 + *piVar6));
              auVar75._4_4_ = piVar8[1] + (piVar1[1] - (piVar7[1] + piVar6[1]));
              auVar75._8_4_ = piVar8[2] + (piVar1[2] - (piVar7[2] + piVar6[2]));
              auVar75._12_4_ = piVar8[3] + (piVar1[3] - (piVar7[3] + piVar6[3]));
              if (iVar70 < 4) {
                auVar72 = auVar72 & *(undefined1 (*) [16])(local_78 + (long)iVar70 * 0x10);
                auVar75 = auVar75 & *(undefined1 (*) [16])(local_78 + (long)iVar70 * 0x10);
              }
              if (bit_depth < 9) {
                auVar86 = pmaddwd(auVar72,auVar72);
                auVar77 = pmulld(auVar75,auVar58);
              }
              else {
                uVar39 = (ulong)uVar2;
                auVar76._0_4_ = auVar75._0_4_ + in_XMM2._0_4_ >> uVar39;
                auVar76._4_4_ = auVar75._4_4_ + in_XMM2._4_4_ >> uVar39;
                auVar76._8_4_ = auVar75._8_4_ + in_XMM2._8_4_ >> uVar39;
                auVar76._12_4_ = auVar75._12_4_ + in_XMM2._12_4_ >> uVar39;
                uVar39 = (ulong)(bit_depth - 8U);
                auVar85._0_4_ = (uint)(in_XMM3._0_4_ + auVar72._0_4_) >> uVar39;
                auVar85._4_4_ = (uint)(in_XMM3._0_4_ + auVar72._4_4_) >> uVar39;
                auVar85._8_4_ = (uint)(in_XMM3._0_4_ + auVar72._8_4_) >> uVar39;
                auVar85._12_4_ = (uint)(in_XMM3._0_4_ + auVar72._12_4_) >> uVar39;
                auVar86 = pmaddwd(auVar85,auVar85);
                auVar75 = pmulld(auVar76,auVar58);
                iVar66 = auVar86._0_4_;
                iVar60 = auVar75._0_4_;
                auVar77._0_4_ = (uint)(iVar60 < iVar66) * iVar66 | (uint)(iVar60 >= iVar66) * iVar60
                ;
                iVar66 = auVar86._4_4_;
                iVar60 = auVar75._4_4_;
                auVar77._4_4_ = (uint)(iVar60 < iVar66) * iVar66 | (uint)(iVar60 >= iVar66) * iVar60
                ;
                iVar66 = auVar86._8_4_;
                iVar60 = auVar75._8_4_;
                iVar61 = auVar75._12_4_;
                auVar77._8_4_ = (uint)(iVar60 < iVar66) * iVar66 | (uint)(iVar60 >= iVar66) * iVar60
                ;
                iVar66 = auVar86._12_4_;
                auVar77._12_4_ =
                     (uint)(iVar61 < iVar66) * iVar66 | (uint)(iVar61 >= iVar66) * iVar61;
              }
              auVar78._0_4_ = auVar77._0_4_ - auVar86._0_4_;
              auVar78._4_4_ = auVar77._4_4_ - auVar86._4_4_;
              auVar78._8_4_ = auVar77._8_4_ - auVar86._8_4_;
              auVar78._12_4_ = auVar77._12_4_ - auVar86._12_4_;
              auVar86 = pmulld(auVar78,auVar63);
              uVar74 = (uint)(auVar86._0_4_ + in_XMM7._0_4_) >> 0x14;
              uVar43 = (uint)(auVar86._4_4_ + in_XMM7._4_4_) >> 0x14;
              uVar83 = (uint)(auVar86._8_4_ + in_XMM7._8_4_) >> 0x14;
              uVar84 = (uint)(auVar86._12_4_ + in_XMM7._12_4_) >> 0x14;
              iVar66 = in_XMM8._0_4_;
              iVar60 = in_XMM8._4_4_;
              iVar61 = in_XMM8._8_4_;
              iVar64 = in_XMM8._12_4_;
              iVar66 = av1_x_by_xplus1
                       [(uint)(iVar66 < (int)uVar74) * iVar66 | (iVar66 >= (int)uVar74) * uVar74];
              iVar60 = av1_x_by_xplus1
                       [(uint)(iVar60 < (int)uVar43) * iVar60 | (iVar60 >= (int)uVar43) * uVar43];
              iVar61 = av1_x_by_xplus1
                       [(uint)(iVar61 < (int)uVar83) * iVar61 | (iVar61 >= (int)uVar83) * uVar83];
              iVar64 = av1_x_by_xplus1
                       [(uint)(iVar64 < (int)uVar84) * iVar64 | (iVar64 >= (int)uVar84) * uVar84];
              puVar3 = (undefined8 *)((long)pvVar34 + lVar35 * 4 + 0x1c);
              *puVar3 = CONCAT44(iVar60,iVar66);
              puVar3[1] = CONCAT44(iVar64,iVar61);
              auVar87._0_4_ = in_XMM9._0_4_ - iVar66;
              auVar87._4_4_ = in_XMM9._4_4_ - iVar60;
              auVar87._8_4_ = in_XMM9._8_4_ - iVar61;
              auVar87._12_4_ = in_XMM9._12_4_ - iVar64;
              auVar86 = pmaddwd(auVar87,auVar71);
              auVar86 = pmulld(auVar86,auVar72);
              puVar9 = (uint *)((long)pvVar34 + lVar35 * 4 + 0x7eac);
              *puVar9 = (uint)(auVar86._0_4_ + in_XMM10._0_4_) >> 0xc;
              puVar9[1] = (uint)(auVar86._4_4_ + in_XMM10._4_4_) >> 0xc;
              puVar9[2] = (uint)(auVar86._8_4_ + in_XMM10._8_4_) >> 0xc;
              puVar9[3] = (uint)(auVar86._12_4_ + in_XMM10._12_4_) >> 0xc;
              lVar35 = lVar35 + 4;
              iVar70 = iVar70 + -4;
            } while (lVar35 <= lVar47);
          }
          lVar38 = lVar38 + 2;
          pvVar34 = (void *)((long)pvVar34 + lVar42);
          lVar37 = lVar37 + lVar42;
          lVar44 = lVar44 + lVar42;
          lVar40 = lVar40 + lVar42;
          lVar48 = lVar48 + lVar42;
        } while (lVar38 <= height);
      }
      puVar45 = (uint8_t *)((long)dgd8 * 2);
      if (highbd == 0) {
        puVar45 = dgd8;
      }
      if (0 < height) {
        lVar38 = lVar32 * 4;
        lVar40 = (long)__s_00 + lVar32 * 4 + lVar36 * 4 + 0x7eb0;
        lVar42 = (long)__s_00 + lVar32 * 8 + lVar36 * 4 + 0x7eb0;
        lVar37 = (long)__s_00 + lVar36 * 4 + 0x7eb0;
        iVar70 = 0;
        auVar63 = pmovsxwd(auVar63,0x100010001000100);
        auVar86 = pmovzxbd(auVar58,0x80808080);
        uVar39 = 0;
        do {
          if ((uVar39 & 1) == 0) {
            if (0 < width) {
              lVar48 = 0;
              do {
                auVar55._8_8_ = 0;
                auVar55._0_8_ = *(ulong *)(puVar45 + (iVar70 + (int)lVar48 << (bVar33 & 0x1f)));
                if (highbd == 0) {
                  auVar58 = pmovzxbd(in_XMM3,auVar55);
                }
                else {
                  auVar58 = pmovzxwd(in_XMM3,auVar55);
                }
                piVar1 = (int *)(lVar37 + -0x7e98 + lVar48 * 4);
                piVar6 = (int *)(lVar37 + -0x7e94 + lVar48 * 4);
                piVar7 = (int *)(lVar37 + -0x7e90 + lVar48 * 4);
                piVar8 = (int *)(lVar42 + -0x7e98 + lVar48 * 4);
                piVar10 = (int *)(lVar42 + -0x7e94 + lVar48 * 4);
                in_XMM7._0_4_ = *piVar10 + *piVar6;
                in_XMM7._4_4_ = piVar10[1] + piVar6[1];
                in_XMM7._8_4_ = piVar10[2] + piVar6[2];
                in_XMM7._12_4_ = piVar10[3] + piVar6[3];
                piVar6 = (int *)(lVar42 + -0x7e90 + lVar48 * 4);
                auVar56._4_4_ =
                     (piVar6[1] + piVar8[1] + piVar7[1] + piVar1[1]) * 5 + in_XMM7._4_4_ * 6;
                auVar56._0_4_ = (*piVar6 + *piVar8 + *piVar7 + *piVar1) * 5 + in_XMM7._0_4_ * 6;
                auVar56._8_4_ =
                     (piVar6[2] + piVar8[2] + piVar7[2] + piVar1[2]) * 5 + in_XMM7._8_4_ * 6;
                auVar56._12_4_ =
                     (piVar6[3] + piVar8[3] + piVar7[3] + piVar1[3]) * 5 + in_XMM7._12_4_ * 6;
                in_XMM2 = pmaddwd(auVar56,auVar58);
                piVar7 = (int *)(lVar37 + -8 + lVar48 * 4);
                piVar8 = (int *)(lVar37 + -4 + lVar48 * 4);
                piVar1 = (int *)(lVar37 + lVar48 * 4);
                piVar10 = (int *)(lVar42 + -8 + lVar48 * 4);
                piVar4 = (int *)(lVar42 + -4 + lVar48 * 4);
                piVar6 = (int *)(lVar42 + lVar48 * 4);
                in_XMM3._0_4_ =
                     (*piVar6 + *piVar10 + *piVar1 + *piVar7) * 5 + (*piVar4 + *piVar8) * 6 +
                     in_XMM2._0_4_ + auVar63._0_4_ >> 9;
                in_XMM3._4_4_ =
                     (piVar6[1] + piVar10[1] + piVar1[1] + piVar7[1]) * 5 +
                     (piVar4[1] + piVar8[1]) * 6 + in_XMM2._4_4_ + auVar63._4_4_ >> 9;
                in_XMM3._8_4_ =
                     (piVar6[2] + piVar10[2] + piVar1[2] + piVar7[2]) * 5 +
                     (piVar4[2] + piVar8[2]) * 6 + in_XMM2._8_4_ + auVar63._8_4_ >> 9;
                in_XMM3._12_4_ =
                     (piVar6[3] + piVar10[3] + piVar1[3] + piVar7[3]) * 5 +
                     (piVar4[3] + piVar8[3]) * 6 + in_XMM2._12_4_ + auVar63._12_4_ >> 9;
                *(undefined1 (*) [16])(flt0 + lVar48) = in_XMM3;
                lVar48 = lVar48 + 4;
              } while (lVar48 < lVar47);
            }
          }
          else if (0 < width) {
            lVar48 = 0;
            do {
              auVar57._8_8_ = 0;
              auVar57._0_8_ = *(ulong *)(puVar45 + (iVar70 + (int)lVar48 << (bVar33 & 0x1f)));
              if (highbd == 0) {
                auVar58 = pmovzxbd(auVar57,auVar57);
              }
              else {
                auVar58 = pmovzxwd(auVar57,auVar57);
              }
              piVar1 = (int *)(lVar40 + -0x7e98 + lVar48 * 4);
              piVar6 = (int *)(lVar40 + -0x7e94 + lVar48 * 4);
              piVar7 = (int *)(lVar40 + -0x7e90 + lVar48 * 4);
              auVar59._4_4_ = piVar1[1] * 5 + piVar6[1] * 6 + piVar7[1] * 5;
              auVar59._0_4_ = *piVar1 * 5 + *piVar6 * 6 + *piVar7 * 5;
              auVar59._8_4_ = piVar1[2] * 5 + piVar6[2] * 6 + piVar7[2] * 5;
              auVar59._12_4_ = piVar1[3] * 5 + piVar6[3] * 6 + piVar7[3] * 5;
              in_XMM3 = pmaddwd(auVar59,auVar58);
              piVar6 = (int *)(lVar40 + -8 + lVar48 * 4);
              piVar7 = (int *)(lVar40 + -4 + lVar48 * 4);
              iVar66 = piVar7[1];
              iVar60 = piVar7[2];
              iVar61 = piVar7[3];
              piVar1 = (int *)(lVar40 + lVar48 * 4);
              in_XMM2._0_4_ = *piVar6 + *piVar7 + *piVar1;
              in_XMM2._4_4_ = piVar6[1] + iVar66 + piVar1[1];
              in_XMM2._8_4_ = piVar6[2] + iVar60 + piVar1[2];
              in_XMM2._12_4_ = piVar6[3] + iVar61 + piVar1[3];
              piVar5 = flt0 + lVar48;
              *piVar5 = (int)(in_XMM2._0_4_ * 5 + *piVar7 + in_XMM3._0_4_ + auVar86._0_4_) >> 8;
              piVar5[1] = (int)(in_XMM2._4_4_ * 5 + iVar66 + in_XMM3._4_4_ + auVar86._4_4_) >> 8;
              piVar5[2] = (int)(in_XMM2._8_4_ * 5 + iVar60 + in_XMM3._8_4_ + auVar86._8_4_) >> 8;
              piVar5[3] = (int)(in_XMM2._12_4_ * 5 + iVar61 + in_XMM3._12_4_ + auVar86._12_4_) >> 8;
              lVar48 = lVar48 + 4;
            } while (lVar48 < lVar47);
          }
          uVar39 = uVar39 + 1;
          flt0 = flt0 + flt_stride;
          iVar70 = iVar70 + dgd_stride;
          lVar40 = lVar40 + lVar38;
          lVar42 = lVar42 + lVar38;
          lVar37 = lVar37 + lVar38;
        } while (uVar39 != (uint)height);
      }
    }
    uVar74 = av1_sgr_params[lVar46].r[1];
    if (0 < (int)uVar74) {
      iVar66 = uVar74 * 2 + 1;
      iVar66 = iVar66 * iVar66;
      iVar70 = av1_sgr_params[lVar46].s[1];
      iVar14 = av1_one_by_x[iVar66 - 1];
      uVar39 = 0x20;
      pauVar41 = (undefined1 (*) [16])local_78;
      do {
        auVar50._8_4_ = 0xffffffff;
        auVar50._0_8_ = 0xffffffffffffffff;
        auVar50._12_4_ = 0xffffffff;
        auVar51._0_8_ = 0xffffffffffffffff >> (uVar39 & 0xffffffff);
        auVar51._8_8_ = auVar50._8_8_ >> (uVar39 & 0xffffffff);
        auVar49 = pmovsxbd(ZEXT416((uint)uVar39),auVar51);
        *pauVar41 = auVar49;
        pauVar41 = pauVar41 + 1;
        uVar39 = uVar39 - 8;
      } while (uVar39 != 0);
      if (-2 < height) {
        auVar49._4_4_ = iVar70;
        auVar49._0_4_ = iVar70;
        auVar49._8_4_ = iVar70;
        auVar49._12_4_ = iVar70;
        lVar37 = (long)(int)((uVar74 + 1) * iVar31);
        auVar52._4_4_ = iVar66;
        auVar52._0_4_ = iVar66;
        auVar52._8_4_ = iVar66;
        auVar52._12_4_ = iVar66;
        uVar2 = bit_depth * 2 - 0x10;
        uVar43 = 1 << ((byte)uVar2 & 0x1f);
        in_XMM2._0_4_ = uVar43 >> 1;
        in_XMM2._4_4_ = uVar43 >> 1;
        in_XMM2._8_4_ = uVar43 >> 1;
        in_XMM2._12_4_ = uVar43 >> 1;
        iVar70 = (1 << ((byte)(bit_depth - 8U) & 0x1f)) >> 1;
        auVar67._4_4_ = iVar14;
        auVar67._0_4_ = iVar14;
        auVar67._8_4_ = iVar14;
        auVar67._12_4_ = iVar14;
        pvVar34 = (void *)((long)__s_00 + lVar36 * 4);
        lVar38 = lVar32 * 4;
        lVar46 = lVar36 * 4 + (long)(int)(uVar74 * iVar31) * 4;
        lVar42 = (long)__s_00 + lVar46 + (ulong)uVar74 * 4 + 0xfd38;
        lVar40 = (long)__s_00 + (ulong)uVar74 * 4 + lVar36 * 4 + lVar37 * -4 + 0xfd38;
        lVar46 = (long)__s_00 + lVar46 + (long)(int)~uVar74 * 4 + 0xfd38;
        lVar37 = (long)__s_00 + lVar36 * 4 + (long)(int)~uVar74 * 4 + lVar37 * -4 + 0xfd38;
        uVar39 = 0xffffffffffffffff;
        auVar63 = pmovsxbw(in_XMM7,0x800080008000800);
        auVar86 = pmovzxbd(in_XMM8,0xffffffff);
        auVar58 = pmovsxwd(in_XMM9,0x100010001000100);
        auVar71 = pmovsxwd(in_XMM10,0x800080008000800);
        do {
          if (-2 < width) {
            lVar48 = -1;
            iVar31 = width + 2;
            do {
              piVar1 = (int *)(lVar37 + 0x7e94 + lVar48 * 4);
              piVar6 = (int *)(lVar40 + 0x7e94 + lVar48 * 4);
              piVar7 = (int *)(lVar46 + 0x7e94 + lVar48 * 4);
              piVar8 = (int *)(lVar42 + 0x7e94 + lVar48 * 4);
              auVar73._0_4_ = *piVar8 + (*piVar1 - (*piVar7 + *piVar6));
              auVar73._4_4_ = piVar8[1] + (piVar1[1] - (piVar7[1] + piVar6[1]));
              auVar73._8_4_ = piVar8[2] + (piVar1[2] - (piVar7[2] + piVar6[2]));
              auVar73._12_4_ = piVar8[3] + (piVar1[3] - (piVar7[3] + piVar6[3]));
              piVar1 = (int *)(lVar37 + 4 + lVar48 * 4);
              piVar6 = (int *)(lVar40 + 4 + lVar48 * 4);
              piVar7 = (int *)(lVar46 + 4 + lVar48 * 4);
              piVar8 = (int *)(lVar42 + 4 + lVar48 * 4);
              auVar79._0_4_ = *piVar8 + (*piVar1 - (*piVar7 + *piVar6));
              auVar79._4_4_ = piVar8[1] + (piVar1[1] - (piVar7[1] + piVar6[1]));
              auVar79._8_4_ = piVar8[2] + (piVar1[2] - (piVar7[2] + piVar6[2]));
              auVar79._12_4_ = piVar8[3] + (piVar1[3] - (piVar7[3] + piVar6[3]));
              if (iVar31 < 4) {
                auVar73 = auVar73 & *(undefined1 (*) [16])(local_78 + (long)iVar31 * 0x10);
                auVar79 = auVar79 & *(undefined1 (*) [16])(local_78 + (long)iVar31 * 0x10);
              }
              if (bit_depth < 9) {
                auVar72 = pmaddwd(auVar73,auVar73);
                auVar81 = pmulld(auVar79,auVar52);
              }
              else {
                uVar62 = (ulong)uVar2;
                auVar80._0_4_ = auVar79._0_4_ + in_XMM2._0_4_ >> uVar62;
                auVar80._4_4_ = auVar79._4_4_ + in_XMM2._4_4_ >> uVar62;
                auVar80._8_4_ = auVar79._8_4_ + in_XMM2._8_4_ >> uVar62;
                auVar80._12_4_ = auVar79._12_4_ + in_XMM2._12_4_ >> uVar62;
                uVar62 = (ulong)(bit_depth - 8U);
                auVar88._0_4_ = (uint)(iVar70 + auVar73._0_4_) >> uVar62;
                auVar88._4_4_ = (uint)(iVar70 + auVar73._4_4_) >> uVar62;
                auVar88._8_4_ = (uint)(iVar70 + auVar73._8_4_) >> uVar62;
                auVar88._12_4_ = (uint)(iVar70 + auVar73._12_4_) >> uVar62;
                auVar72 = pmaddwd(auVar88,auVar88);
                auVar75 = pmulld(auVar80,auVar52);
                iVar66 = auVar72._0_4_;
                iVar60 = auVar75._0_4_;
                auVar81._0_4_ = (uint)(iVar60 < iVar66) * iVar66 | (uint)(iVar60 >= iVar66) * iVar60
                ;
                iVar66 = auVar72._4_4_;
                iVar60 = auVar75._4_4_;
                auVar81._4_4_ = (uint)(iVar60 < iVar66) * iVar66 | (uint)(iVar60 >= iVar66) * iVar60
                ;
                iVar66 = auVar72._8_4_;
                iVar60 = auVar75._8_4_;
                iVar61 = auVar75._12_4_;
                auVar81._8_4_ = (uint)(iVar60 < iVar66) * iVar66 | (uint)(iVar60 >= iVar66) * iVar60
                ;
                iVar66 = auVar72._12_4_;
                auVar81._12_4_ =
                     (uint)(iVar61 < iVar66) * iVar66 | (uint)(iVar61 >= iVar66) * iVar61;
              }
              auVar82._0_4_ = auVar81._0_4_ - auVar72._0_4_;
              auVar82._4_4_ = auVar81._4_4_ - auVar72._4_4_;
              auVar82._8_4_ = auVar81._8_4_ - auVar72._8_4_;
              auVar82._12_4_ = auVar81._12_4_ - auVar72._12_4_;
              auVar72 = pmulld(auVar82,auVar49);
              uVar74 = (uint)(auVar72._0_4_ + auVar63._0_4_) >> 0x14;
              uVar43 = (uint)(auVar72._4_4_ + auVar63._4_4_) >> 0x14;
              uVar83 = (uint)(auVar72._8_4_ + auVar63._8_4_) >> 0x14;
              uVar84 = (uint)(auVar72._12_4_ + auVar63._12_4_) >> 0x14;
              iVar66 = auVar86._0_4_;
              iVar60 = auVar86._4_4_;
              iVar61 = auVar86._8_4_;
              iVar64 = auVar86._12_4_;
              iVar66 = av1_x_by_xplus1
                       [(uint)(iVar66 < (int)uVar74) * iVar66 | (iVar66 >= (int)uVar74) * uVar74];
              iVar60 = av1_x_by_xplus1
                       [(uint)(iVar60 < (int)uVar43) * iVar60 | (iVar60 >= (int)uVar43) * uVar43];
              iVar61 = av1_x_by_xplus1
                       [(uint)(iVar61 < (int)uVar83) * iVar61 | (iVar61 >= (int)uVar83) * uVar83];
              iVar64 = av1_x_by_xplus1
                       [(uint)(iVar64 < (int)uVar84) * iVar64 | (iVar64 >= (int)uVar84) * uVar84];
              puVar3 = (undefined8 *)((long)pvVar34 + lVar48 * 4 + 0x1c);
              *puVar3 = CONCAT44(iVar60,iVar66);
              puVar3[1] = CONCAT44(iVar64,iVar61);
              auVar89._0_4_ = auVar58._0_4_ - iVar66;
              auVar89._4_4_ = auVar58._4_4_ - iVar60;
              auVar89._8_4_ = auVar58._8_4_ - iVar61;
              auVar89._12_4_ = auVar58._12_4_ - iVar64;
              auVar72 = pmaddwd(auVar89,auVar67);
              auVar72 = pmulld(auVar72,auVar73);
              puVar9 = (uint *)((long)pvVar34 + lVar48 * 4 + 0x7eac);
              *puVar9 = (uint)(auVar72._0_4_ + auVar71._0_4_) >> 0xc;
              puVar9[1] = (uint)(auVar72._4_4_ + auVar71._4_4_) >> 0xc;
              puVar9[2] = (uint)(auVar72._8_4_ + auVar71._8_4_) >> 0xc;
              puVar9[3] = (uint)(auVar72._12_4_ + auVar71._12_4_) >> 0xc;
              lVar48 = lVar48 + 4;
              iVar31 = iVar31 + -4;
            } while (lVar48 <= lVar47);
          }
          uVar39 = uVar39 + 1;
          pvVar34 = (void *)((long)pvVar34 + lVar38);
          lVar42 = lVar42 + lVar38;
          lVar40 = lVar40 + lVar38;
          lVar46 = lVar46 + lVar38;
          lVar37 = lVar37 + lVar38;
        } while (uVar39 != height + 1);
      }
      puVar45 = (uint8_t *)((long)dgd8 * 2);
      if (highbd == 0) {
        puVar45 = dgd8;
      }
      if (0 < height) {
        lVar46 = (long)__s_00 + lVar32 * 8 + lVar36 * 4 + 0x7eb0;
        lVar38 = (long)__s_00 + lVar32 * 4 + lVar36 * 4 + 0x7eb0;
        lVar32 = lVar32 * 4;
        lVar36 = (long)__s_00 + lVar36 * 4 + 0x7eb0;
        iVar31 = 0;
        auVar63 = pmovsxwd(auVar49,0x100010001000100);
        uVar39 = 0;
        do {
          if (0 < width) {
            lVar42 = 0;
            do {
              auVar53._8_8_ = 0;
              auVar53._0_8_ = *(ulong *)(puVar45 + (iVar31 + (int)lVar42 << (bVar33 & 0x1f)));
              if (highbd == 0) {
                auVar86 = pmovzxbd(in_XMM2,auVar53);
              }
              else {
                auVar86 = pmovzxwd(in_XMM2,auVar53);
              }
              piVar1 = (int *)(lVar36 + -0x7e98 + lVar42 * 4);
              piVar6 = (int *)(lVar36 + -0x7e94 + lVar42 * 4);
              piVar7 = (int *)(lVar36 + -0x7e90 + lVar42 * 4);
              piVar8 = (int *)(lVar38 + -0x7e98 + lVar42 * 4);
              piVar10 = (int *)(lVar38 + -0x7e94 + lVar42 * 4);
              piVar4 = (int *)(lVar38 + -0x7e90 + lVar42 * 4);
              piVar11 = (int *)(lVar46 + -0x7e98 + lVar42 * 4);
              piVar12 = (int *)(lVar46 + -0x7e94 + lVar42 * 4);
              piVar13 = (int *)(lVar46 + -0x7e90 + lVar42 * 4);
              auVar54._0_4_ =
                   (*piVar12 + *piVar4 + *piVar10 + *piVar8 + *piVar6) * 4 +
                   (*piVar13 + *piVar11 + *piVar7 + *piVar1) * 3;
              auVar54._4_4_ =
                   (piVar12[1] + piVar4[1] + piVar10[1] + piVar8[1] + piVar6[1]) * 4 +
                   (piVar13[1] + piVar11[1] + piVar7[1] + piVar1[1]) * 3;
              auVar54._8_4_ =
                   (piVar12[2] + piVar4[2] + piVar10[2] + piVar8[2] + piVar6[2]) * 4 +
                   (piVar13[2] + piVar11[2] + piVar7[2] + piVar1[2]) * 3;
              auVar54._12_4_ =
                   (piVar12[3] + piVar4[3] + piVar10[3] + piVar8[3] + piVar6[3]) * 4 +
                   (piVar13[3] + piVar11[3] + piVar7[3] + piVar1[3]) * 3;
              auVar86 = pmaddwd(auVar54,auVar86);
              piVar8 = (int *)(lVar36 + -8 + lVar42 * 4);
              iVar70 = piVar8[1];
              iVar66 = piVar8[2];
              iVar60 = piVar8[3];
              piVar10 = (int *)(lVar36 + -4 + lVar42 * 4);
              iVar61 = piVar10[1];
              iVar64 = piVar10[2];
              iVar65 = piVar10[3];
              piVar1 = (int *)(lVar36 + lVar42 * 4);
              iVar68 = piVar1[1];
              iVar69 = piVar1[2];
              iVar15 = piVar1[3];
              piVar4 = (int *)(lVar38 + -8 + lVar42 * 4);
              iVar16 = piVar4[1];
              iVar17 = piVar4[2];
              iVar18 = piVar4[3];
              piVar11 = (int *)(lVar38 + -4 + lVar42 * 4);
              iVar19 = piVar11[1];
              iVar20 = piVar11[2];
              iVar21 = piVar11[3];
              piVar6 = (int *)(lVar38 + lVar42 * 4);
              iVar22 = piVar6[1];
              iVar23 = piVar6[2];
              iVar24 = piVar6[3];
              in_XMM2 = *(undefined1 (*) [16])(lVar46 + -8 + lVar42 * 4);
              piVar12 = (int *)(lVar46 + -4 + lVar42 * 4);
              iVar25 = piVar12[1];
              iVar26 = piVar12[2];
              iVar27 = piVar12[3];
              piVar7 = (int *)(lVar46 + lVar42 * 4);
              iVar28 = piVar7[1];
              iVar29 = piVar7[2];
              iVar30 = piVar7[3];
              piVar5 = flt1 + lVar42;
              *piVar5 = auVar86._0_4_ + (*piVar7 + in_XMM2._0_4_ + *piVar1 + *piVar8) * 3 +
                        (*piVar12 + *piVar6 + *piVar11 + *piVar4 + *piVar10) * 4 + auVar63._0_4_ >>
                        9;
              piVar5[1] = auVar86._4_4_ + (iVar28 + in_XMM2._4_4_ + iVar68 + iVar70) * 3 +
                          (iVar25 + iVar22 + iVar19 + iVar16 + iVar61) * 4 + auVar63._4_4_ >> 9;
              piVar5[2] = auVar86._8_4_ + (iVar29 + in_XMM2._8_4_ + iVar69 + iVar66) * 3 +
                          (iVar26 + iVar23 + iVar20 + iVar17 + iVar64) * 4 + auVar63._8_4_ >> 9;
              piVar5[3] = auVar86._12_4_ + (iVar30 + in_XMM2._12_4_ + iVar15 + iVar60) * 3 +
                          (iVar27 + iVar24 + iVar21 + iVar18 + iVar65) * 4 + auVar63._12_4_ >> 9;
              lVar42 = lVar42 + 4;
            } while (lVar42 < lVar47);
          }
          uVar39 = uVar39 + 1;
          flt1 = flt1 + flt_stride;
          iVar31 = iVar31 + dgd_stride;
          lVar46 = lVar46 + lVar32;
          lVar38 = lVar38 + lVar32;
          lVar36 = lVar36 + lVar32;
        } while (uVar39 != (uint)height);
      }
    }
    aom_free(__s_00);
    iVar31 = 0;
  }
  return iVar31;
}

Assistant:

int av1_selfguided_restoration_sse4_1(const uint8_t *dgd8, int width,
                                      int height, int dgd_stride, int32_t *flt0,
                                      int32_t *flt1, int flt_stride,
                                      int sgr_params_idx, int bit_depth,
                                      int highbd) {
  int32_t *buf = (int32_t *)aom_memalign(
      16, 4 * sizeof(*buf) * RESTORATION_PROC_UNIT_PELS);
  if (!buf) return -1;
  memset(buf, 0, 4 * sizeof(*buf) * RESTORATION_PROC_UNIT_PELS);

  const int width_ext = width + 2 * SGRPROJ_BORDER_HORZ;
  const int height_ext = height + 2 * SGRPROJ_BORDER_VERT;

  // Adjusting the stride of A and B here appears to avoid bad cache effects,
  // leading to a significant speed improvement.
  // We also align the stride to a multiple of 16 bytes for efficiency.
  int buf_stride = ((width_ext + 3) & ~3) + 16;

  // The "tl" pointers point at the top-left of the initialised data for the
  // array. Adding 3 here ensures that column 1 is 16-byte aligned.
  int32_t *Atl = buf + 0 * RESTORATION_PROC_UNIT_PELS + 3;
  int32_t *Btl = buf + 1 * RESTORATION_PROC_UNIT_PELS + 3;
  int32_t *Ctl = buf + 2 * RESTORATION_PROC_UNIT_PELS + 3;
  int32_t *Dtl = buf + 3 * RESTORATION_PROC_UNIT_PELS + 3;

  // The "0" pointers are (- SGRPROJ_BORDER_VERT, -SGRPROJ_BORDER_HORZ). Note
  // there's a zero row and column in A, B (integral images), so we move down
  // and right one for them.
  const int buf_diag_border =
      SGRPROJ_BORDER_HORZ + buf_stride * SGRPROJ_BORDER_VERT;

  int32_t *A0 = Atl + 1 + buf_stride;
  int32_t *B0 = Btl + 1 + buf_stride;
  int32_t *C0 = Ctl + 1 + buf_stride;
  int32_t *D0 = Dtl + 1 + buf_stride;

  // Finally, A, B, C, D point at position (0, 0).
  int32_t *A = A0 + buf_diag_border;
  int32_t *B = B0 + buf_diag_border;
  int32_t *C = C0 + buf_diag_border;
  int32_t *D = D0 + buf_diag_border;

  const int dgd_diag_border =
      SGRPROJ_BORDER_HORZ + dgd_stride * SGRPROJ_BORDER_VERT;
  const uint8_t *dgd0 = dgd8 - dgd_diag_border;

  // Generate integral images from the input. C will contain sums of squares; D
  // will contain just sums
  if (highbd)
    integral_images_highbd(CONVERT_TO_SHORTPTR(dgd0), dgd_stride, width_ext,
                           height_ext, Ctl, Dtl, buf_stride);
  else
    integral_images(dgd0, dgd_stride, width_ext, height_ext, Ctl, Dtl,
                    buf_stride);

  const sgr_params_type *const params = &av1_sgr_params[sgr_params_idx];
  // Write to flt0 and flt1
  // If params->r == 0 we skip the corresponding filter. We only allow one of
  // the radii to be 0, as having both equal to 0 would be equivalent to
  // skipping SGR entirely.
  assert(!(params->r[0] == 0 && params->r[1] == 0));
  assert(params->r[0] < AOMMIN(SGRPROJ_BORDER_VERT, SGRPROJ_BORDER_HORZ));
  assert(params->r[1] < AOMMIN(SGRPROJ_BORDER_VERT, SGRPROJ_BORDER_HORZ));

  if (params->r[0] > 0) {
    calc_ab_fast(A, B, C, D, width, height, buf_stride, bit_depth,
                 sgr_params_idx, 0);
    final_filter_fast(flt0, flt_stride, A, B, buf_stride, dgd8, dgd_stride,
                      width, height, highbd);
  }

  if (params->r[1] > 0) {
    calc_ab(A, B, C, D, width, height, buf_stride, bit_depth, sgr_params_idx,
            1);
    final_filter(flt1, flt_stride, A, B, buf_stride, dgd8, dgd_stride, width,
                 height, highbd);
  }
  aom_free(buf);
  return 0;
}